

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O3

int VP8GetCostLuma16(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int16_t (*paiVar6) [16];
  int16_t (*paiVar7) [16];
  long lVar8;
  VP8Residual res;
  VP8Residual local_60;
  
  pVVar2 = it->enc_;
  VP8IteratorNzToBytes(it);
  local_60.coeff_type = 1;
  local_60.prob = (pVVar2->proba_).coeffs_[1];
  local_60.stats = (pVVar2->proba_).stats_[1];
  local_60.costs = (pVVar2->proba_).remapped_costs_[1];
  local_60.first = 0;
  (*VP8SetResidualCoeffs)(rd->y_dc_levels,&local_60);
  iVar3 = (*VP8GetResidualCost)(it->left_nz_[8] + it->top_nz_[8],&local_60);
  lVar5 = 0;
  local_60.coeff_type = 0;
  local_60.first = 1;
  paiVar6 = rd->y_ac_levels;
  local_60.prob = (pVVar2->proba_).coeffs_[0];
  local_60.stats = (pVVar2->proba_).stats_[0];
  local_60.costs = (pVVar2->proba_).remapped_costs_[0];
  do {
    lVar8 = 0;
    paiVar7 = paiVar6;
    do {
      iVar4 = it->left_nz_[lVar5];
      iVar1 = it->top_nz_[lVar8];
      (*VP8SetResidualCoeffs)(*paiVar7,&local_60);
      iVar4 = (*VP8GetResidualCost)(iVar4 + iVar1,&local_60);
      iVar3 = iVar3 + iVar4;
      it->left_nz_[lVar5] = (uint)~local_60.last >> 0x1f;
      it->top_nz_[lVar8] = (uint)~local_60.last >> 0x1f;
      lVar8 = lVar8 + 1;
      paiVar7 = paiVar7 + 1;
    } while (lVar8 != 4);
    lVar5 = lVar5 + 1;
    paiVar6 = paiVar6 + 4;
  } while (lVar5 != 4);
  return iVar3;
}

Assistant:

int VP8GetCostLuma16(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);   // re-import the non-zero context

  // DC
  VP8InitResidual(0, 1, enc, &res);
  VP8SetResidualCoeffs(rd->y_dc_levels, &res);
  R += VP8GetResidualCost(it->top_nz_[8] + it->left_nz_[8], &res);

  // AC
  VP8InitResidual(1, 0, enc, &res);
  for (y = 0; y < 4; ++y) {
    for (x = 0; x < 4; ++x) {
      const int ctx = it->top_nz_[x] + it->left_nz_[y];
      VP8SetResidualCoeffs(rd->y_ac_levels[x + y * 4], &res);
      R += VP8GetResidualCost(ctx, &res);
      it->top_nz_[x] = it->left_nz_[y] = (res.last >= 0);
    }
  }
  return R;
}